

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

void arkInterpFree_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I)

{
  int iVar1;
  int *__ptr;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int iVar6;
  undefined1 auVar5 [16];
  
  if (I != (ARKInterp)0x0) {
    if (I->content != (void *)0x0) {
      if (*(long *)((long)I->content + 8) != 0) {
        pvVar2 = I->content;
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar4 = 0;
          lVar3 = 0;
          do {
            if (*(long *)(*(long *)((long)pvVar2 + 8) + lVar4) != 0) {
              arkFreeVec(ark_mem,(N_Vector *)(*(long *)((long)pvVar2 + 8) + lVar4));
              *(undefined8 *)(*(long *)((long)I->content + 8) + lVar4) = 0;
            }
            lVar3 = lVar3 + 1;
            pvVar2 = I->content;
            lVar4 = lVar4 + 8;
          } while (lVar3 < *(int *)((long)pvVar2 + 4));
        }
        free(*(void **)((long)pvVar2 + 8));
        *(undefined8 *)((long)I->content + 8) = 0;
      }
      pvVar2 = *(void **)((long)I->content + 0x10);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)I->content + 0x10) = 0;
      }
      __ptr = (int *)I->content;
      iVar1 = *__ptr;
      iVar6 = iVar1 + 1;
      auVar5._4_4_ = iVar1 + 2;
      auVar5._8_4_ = auVar5._4_4_;
      auVar5._12_4_ = -(uint)(auVar5._4_4_ < 0);
      ark_mem->lrw = ark_mem->lrw - CONCAT44(-(uint)(iVar6 < 0),iVar6);
      ark_mem->liw = ark_mem->liw - auVar5._8_8_;
      free(__ptr);
      I->content = (void *)0x0;
    }
    if (I->ops != (ARKInterpOps)0x0) {
      free(I->ops);
      I->ops = (ARKInterpOps)0x0;
    }
    free(I);
    return;
  }
  return;
}

Assistant:

void arkInterpFree_Lagrange(ARKodeMem ark_mem, ARKInterp I)
{
  int i;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) { return; }

  /* free content */
  if (I->content != NULL)
  {
    if (LINT_YHIST(I) != NULL)
    {
      for (i = 0; i < LINT_NMAXALLOC(I); i++)
      {
        if (LINT_YJ(I, i) != NULL)
        {
          arkFreeVec(ark_mem, &(LINT_YJ(I, i)));
          LINT_YJ(I, i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL)
    {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops)
  {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}